

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O2

XYZ __thiscall pbrt::SampledSpectrum::ToXYZ(SampledSpectrum *this,SampledWavelengths *lambda)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Float FVar3;
  Float FVar4;
  undefined1 in_ZMM0 [64];
  undefined1 auVar12 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar11 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar19 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  XYZ XVar20;
  SampledSpectrum SVar21;
  SampledSpectrum SVar22;
  SampledSpectrum Z;
  SampledSpectrum Y;
  SampledSpectrum X;
  SampledSpectrum local_88;
  SampledSpectrum local_78;
  SampledSpectrum local_68;
  SampledSpectrum local_58;
  SampledSpectrum local_48;
  SampledSpectrum local_38;
  undefined1 extraout_var [60];
  
  auVar19 = in_ZMM1._8_56_;
  auVar12 = in_ZMM0._8_56_;
  SVar21 = DenselySampledSpectrum::Sample(Spectra::x,lambda);
  auVar13._0_8_ = SVar21.values.values._8_8_;
  auVar13._8_56_ = auVar19;
  auVar5._0_8_ = SVar21.values.values._0_8_;
  auVar5._8_56_ = auVar12;
  local_38.values.values = (array<float,_4>)vmovlhps_avx(auVar5._0_16_,auVar13._0_16_);
  auVar12 = ZEXT856(local_38.values.values._8_8_);
  SVar21 = DenselySampledSpectrum::Sample(Spectra::y,lambda);
  auVar14._0_8_ = SVar21.values.values._8_8_;
  auVar14._8_56_ = auVar19;
  auVar6._0_8_ = SVar21.values.values._0_8_;
  auVar6._8_56_ = auVar12;
  local_48.values.values = (array<float,_4>)vmovlhps_avx(auVar6._0_16_,auVar14._0_16_);
  auVar12 = ZEXT856(local_48.values.values._8_8_);
  SVar21 = DenselySampledSpectrum::Sample(Spectra::z,lambda);
  auVar15._0_8_ = SVar21.values.values._8_8_;
  auVar15._8_56_ = auVar19;
  auVar7._0_8_ = SVar21.values.values._0_8_;
  auVar7._8_56_ = auVar12;
  local_58.values.values = (array<float,_4>)vmovlhps_avx(auVar7._0_16_,auVar15._0_16_);
  auVar12 = ZEXT856(local_58.values.values._8_8_);
  SVar21 = SampledWavelengths::PDF(lambda);
  SVar22 = operator*(&local_38,this);
  SVar22 = SafeDiv(SVar22,SVar21);
  auVar16._0_8_ = SVar22.values.values._8_8_;
  auVar16._8_56_ = auVar19;
  auVar8._0_8_ = SVar22.values.values._0_8_;
  auVar8._8_56_ = auVar12;
  local_68.values.values = (array<float,_4>)vmovlhps_avx(auVar8._0_16_,auVar16._0_16_);
  auVar9._0_4_ = Average(&local_68);
  auVar9._4_60_ = extraout_var;
  auVar12 = extraout_var._4_56_;
  SVar22 = operator*(&local_48,this);
  SVar22 = SafeDiv(SVar22,SVar21);
  auVar17._0_8_ = SVar22.values.values._8_8_;
  auVar17._8_56_ = auVar19;
  auVar10._0_8_ = SVar22.values.values._0_8_;
  auVar10._8_56_ = auVar12;
  local_78.values.values = (array<float,_4>)vmovlhps_avx(auVar10._0_16_,auVar17._0_16_);
  FVar3 = Average(&local_78);
  auVar12 = extraout_var_00;
  SVar22 = operator*(&local_58,this);
  SVar21 = SafeDiv(SVar22,SVar21);
  auVar18._0_8_ = SVar21.values.values._8_8_;
  auVar18._8_56_ = auVar19;
  auVar11._0_8_ = SVar21.values.values._0_8_;
  auVar11._8_56_ = auVar12;
  local_88.values.values = (array<float,_4>)vmovlhps_avx(auVar11._0_16_,auVar18._0_16_);
  FVar4 = Average(&local_88);
  auVar2 = vinsertps_avx(auVar9._0_16_,ZEXT416((uint)FVar3),0x10);
  auVar1._8_4_ = 0x42d5b6bb;
  auVar1._0_8_ = 0x42d5b6bb42d5b6bb;
  auVar1._12_4_ = 0x42d5b6bb;
  auVar2 = vdivps_avx512vl(auVar2,auVar1);
  XVar20.Z = FVar4 / 106.856895;
  XVar20._0_8_ = auVar2._0_8_;
  return XVar20;
}

Assistant:

XYZ SampledSpectrum::ToXYZ(const SampledWavelengths &lambda) const {
    // Sample the $X$, $Y$, and $Z$ matching curves at _lambda_
    SampledSpectrum X = Spectra::X().Sample(lambda);
    SampledSpectrum Y = Spectra::Y().Sample(lambda);
    SampledSpectrum Z = Spectra::Z().Sample(lambda);

    // Evaluate estimator to compute $(x,y,z)$ coefficients
    SampledSpectrum pdf = lambda.PDF();
    return XYZ(SafeDiv(X * *this, pdf).Average(), SafeDiv(Y * *this, pdf).Average(),
               SafeDiv(Z * *this, pdf).Average()) /
           CIE_Y_integral;
}